

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freeze_spec_constant_value_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::FreezeSpecConstantValuePass::Process(FreezeSpecConstantValuePass *this)

{
  Status SVar1;
  Module *this_00;
  anon_class_16_2_5ed6da09 local_50;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  IRContext *local_20;
  IRContext *ctx;
  FreezeSpecConstantValuePass *pFStack_10;
  bool modified;
  FreezeSpecConstantValuePass *this_local;
  
  ctx._7_1_ = 0;
  pFStack_10 = this;
  local_20 = Pass::context(&this->super_Pass);
  this_00 = IRContext::module(local_20);
  local_50.modified = (bool *)((long)&ctx + 7);
  local_50.ctx = local_20;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::FreezeSpecConstantValuePass::Process()::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_40,&local_50);
  Module::ForEachInst(this_00,&local_40,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
  SVar1 = SuccessWithoutChange;
  if ((ctx._7_1_ & 1) != 0) {
    SVar1 = SuccessWithChange;
  }
  return SVar1;
}

Assistant:

Pass::Status FreezeSpecConstantValuePass::Process() {
  bool modified = false;
  auto ctx = context();
  ctx->module()->ForEachInst([&modified, ctx](Instruction* inst) {
    switch (inst->opcode()) {
      case spv::Op::OpSpecConstant:
        inst->SetOpcode(spv::Op::OpConstant);
        modified = true;
        break;
      case spv::Op::OpSpecConstantTrue:
        inst->SetOpcode(spv::Op::OpConstantTrue);
        modified = true;
        break;
      case spv::Op::OpSpecConstantFalse:
        inst->SetOpcode(spv::Op::OpConstantFalse);
        modified = true;
        break;
      case spv::Op::OpDecorate:
        if (spv::Decoration(inst->GetSingleWordInOperand(1)) ==
            spv::Decoration::SpecId) {
          ctx->KillInst(inst);
          modified = true;
        }
        break;
      default:
        break;
    }
  });
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}